

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry.cpp
# Opt level: O3

void __thiscall
SoapySDR::Registry::Registry
          (Registry *this,string *name,FindFunction *find,MakeFunction *make,string *abi)

{
  pointer pcVar1;
  int iVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *this_00;
  string *psVar3;
  mapped_type *this_01;
  mapped_type *this_02;
  long *plVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  undefined8 uVar7;
  MakeFunction *pp_Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FunctionsEntry entry;
  string *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  MakeFunction *local_70;
  long local_68;
  MakeFunction local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78 = &(this->_name).field_2;
  (this->_name)._M_dataplus._M_p = (pointer)local_78;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)getRegistryMutex()::mutex);
  if (iVar2 != 0) {
    uVar7 = std::__throw_system_error(iVar2);
    if (local_c8 != name) {
      operator_delete(local_c8);
    }
    if (local_70 != make) {
      operator_delete(local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)getRegistryMutex()::mutex);
    pcVar1 = (this->_name)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != local_78) {
      operator_delete(pcVar1);
    }
    _Unwind_Resume(uVar7);
  }
  this_00 = getLoaderResults_abi_cxx11_();
  psVar3 = getModuleLoading_abi_cxx11_();
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::operator[](this_00,psVar3);
  this_02 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_01,name);
  iVar2 = std::__cxx11::string::compare((char *)abi);
  if (iVar2 == 0) {
    getFunctionTable_abi_cxx11_();
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
            ::find(&getFunctionTable[abi:cxx11]()::table_abi_cxx11_._M_t,name);
    if ((_Rb_tree_header *)cVar5._M_node ==
        &getFunctionTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      local_a8._8_8_ = 0;
      local_98._M_dataplus._M_p = local_98._M_dataplus._M_p & 0xffffffffffffff00;
      local_a8._M_allocated_capacity = (size_type)&local_98;
      getModuleLoading_abi_cxx11_();
      std::__cxx11::string::_M_assign((string *)(local_b8 + 0x10));
      local_98.field_2._M_allocated_capacity = (size_type)*find;
      local_98.field_2._8_8_ = *make;
      getFunctionTable_abi_cxx11_();
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
               ::operator[](&getFunctionTable[abi:cxx11]()::table_abi_cxx11_,name);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      pmVar6->find = (FindFunction)local_98.field_2._M_allocated_capacity;
      pmVar6->make = (MakeFunction)local_98.field_2._8_8_;
      std::__cxx11::string::_M_assign((string *)this);
      local_50._M_dataplus._M_p = (pointer)local_a8._M_allocated_capacity;
      if ((string *)local_a8._M_allocated_capacity == &local_98) goto LAB_0012474c;
    }
    else {
      std::operator+(&local_50,"duplicate entry for ",name);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      pp_Var8 = (MakeFunction *)(plVar4 + 2);
      if ((MakeFunction *)*plVar4 == pp_Var8) {
        local_60 = *pp_Var8;
        lStack_58 = plVar4[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *pp_Var8;
        local_70 = (MakeFunction *)*plVar4;
      }
      local_68 = plVar4[1];
      *plVar4 = (long)pp_Var8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      getFunctionTable_abi_cxx11_();
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
               ::operator[](&getFunctionTable[abi:cxx11]()::table_abi_cxx11_,name);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)(pmVar6->modulePath)._M_dataplus._M_p);
      psVar3 = (string *)(plVar4 + 2);
      if ((string *)*plVar4 == psVar3) {
        local_b8._0_8_ = (psVar3->_M_dataplus)._M_p;
        local_b8._8_8_ = plVar4[3];
        local_c8 = (string *)local_b8;
      }
      else {
        local_b8._0_8_ = (psVar3->_M_dataplus)._M_p;
        local_c8 = (string *)*plVar4;
      }
      local_c0 = plVar4[1];
      *plVar4 = (long)psVar3;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
      psVar3 = (string *)(plVar4 + 2);
      if ((string *)*plVar4 == psVar3) {
        local_98._M_dataplus._M_p = (psVar3->_M_dataplus)._M_p;
        local_98._M_string_length = plVar4[3];
        local_a8._M_allocated_capacity = (size_type)&local_98;
      }
      else {
        local_98._M_dataplus._M_p = (psVar3->_M_dataplus)._M_p;
        local_a8._M_allocated_capacity = (size_type)(string *)*plVar4;
      }
      local_a8._8_8_ = plVar4[1];
      *plVar4 = (long)psVar3;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)this_02,(string *)(local_b8 + 0x10));
      if ((string *)local_a8._M_allocated_capacity != &local_98) {
        operator_delete((void *)local_a8._M_allocated_capacity);
      }
      if (local_c8 != (string *)local_b8) {
        operator_delete(local_c8);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0012474c;
    }
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_c8 = (string *)local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar1,pcVar1 + name->_M_string_length);
    std::__cxx11::string::append((char *)&local_c8);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_c8,(ulong)(abi->_M_dataplus)._M_p);
    psVar3 = (string *)(plVar4 + 2);
    if ((string *)*plVar4 == psVar3) {
      local_98._M_dataplus._M_p = (psVar3->_M_dataplus)._M_p;
      local_98._M_string_length = plVar4[3];
      local_a8._M_allocated_capacity = (size_type)&local_98;
    }
    else {
      local_98._M_dataplus._M_p = (psVar3->_M_dataplus)._M_p;
      local_a8._M_allocated_capacity = (size_type)(string *)*plVar4;
    }
    local_a8._8_8_ = plVar4[1];
    *plVar4 = (long)psVar3;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)this_02,(string *)(local_b8 + 0x10));
    if ((string *)local_a8._M_allocated_capacity != &local_98) {
      operator_delete((void *)local_a8._M_allocated_capacity);
    }
    local_50._M_dataplus._M_p = (pointer)local_c8;
    if (local_c8 == (string *)local_b8) goto LAB_0012474c;
  }
  operator_delete(local_50._M_dataplus._M_p);
LAB_0012474c:
  pthread_mutex_unlock((pthread_mutex_t *)getRegistryMutex()::mutex);
  return;
}

Assistant:

SoapySDR::Registry::Registry(const std::string &name, const FindFunction &find, const MakeFunction &make, const std::string &abi)
{
    std::lock_guard<std::recursive_mutex> lock(getRegistryMutex());

    //create an entry for the loader result
    std::string &errorMsg = getLoaderResults()[getModuleLoading()][name];

    //abi check
    if (abi != SOAPY_SDR_ABI_VERSION)
    {
        errorMsg = name + " failed ABI check: Library ABI=" SOAPY_SDR_ABI_VERSION ", Module ABI="+abi;
        return;
    }

    //duplicate check
    if (getFunctionTable().count(name) != 0)
    {
        errorMsg = "duplicate entry for " + name + " ("+getFunctionTable()[name].modulePath + ")";
        return;
    }

    //register functions
    FunctionsEntry entry;
    entry.modulePath = getModuleLoading();
    entry.find = find;
    entry.make = make;
    getFunctionTable()[name] = entry;
    _name = name;
}